

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  TValue *pTVar1;
  size_t len;
  lua_State *L;
  
  if (i < ms->level) {
    len = ms->capture[i].len;
    L = ms->L;
    if (len == 0xfffffffffffffffe) {
      L->top->n = (double)(long)(ms->capture[i].init + (1 - (long)ms->src_init));
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      if (pTVar1 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
        return;
      }
      lj_state_growstack(L,1);
      return;
    }
    if (len == 0xffffffffffffffff) {
      lj_err_caller(L,LJ_ERR_STRCAPU);
    }
    s = ms->capture[i].init;
  }
  else {
    L = ms->L;
    if (i != 0) {
      lj_err_caller(L,LJ_ERR_STRCAPI);
    }
    len = (long)e - (long)s;
  }
  lua_pushlstring(L,s,len);
  return;
}

Assistant:

static void push_onecapture(MatchState *ms, int i, const char *s, const char *e)
{
  if (i >= ms->level) {
    if (i == 0)  /* ms->level == 0, too */
      lua_pushlstring(ms->L, s, (size_t)(e - s));  /* add whole match */
    else
      lj_err_caller(ms->L, LJ_ERR_STRCAPI);
  } else {
    ptrdiff_t l = ms->capture[i].len;
    if (l == CAP_UNFINISHED) lj_err_caller(ms->L, LJ_ERR_STRCAPU);
    if (l == CAP_POSITION)
      lua_pushinteger(ms->L, ms->capture[i].init - ms->src_init + 1);
    else
      lua_pushlstring(ms->L, ms->capture[i].init, (size_t)l);
  }
}